

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamtests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_59e0::ktxStreamTest_CanWriteKtx1AsKtx2ToCppStream_Test::TestBody
          (ktxStreamTest_CanWriteKtx1AsKtx2ToCppStream_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  ktxStream *pkVar3;
  ktxTexture1 **ppkVar4;
  ktxTexture1 *this_00;
  streambuf *psVar5;
  ktxTexture2 **ppkVar6;
  Message *pMVar7;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  StreambufStream srcStream;
  KtxTexture<ktxTexture2> dstTexture2;
  KtxTexture<ktxTexture1> srcTexture1;
  StreambufStream dstStream;
  __single_object dstStreambuf;
  ktx_error_code_e err;
  char (*in_stack_fffffffffffffd18) [64];
  fpos<__mbstate_t> *in_stack_fffffffffffffd20;
  unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffd28;
  unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffd30;
  Message *in_stack_fffffffffffffd38;
  int line;
  char *in_stack_fffffffffffffd40;
  unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  *in_stack_fffffffffffffd48;
  Type type;
  StreambufStream *in_stack_fffffffffffffd50;
  StreambufStream *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  char *in_stack_fffffffffffffd90;
  AssertionResult *in_stack_fffffffffffffd98;
  AssertHelper *in_stack_fffffffffffffda0;
  AssertionResult local_1c8;
  char *local_1b0;
  undefined4 local_19c;
  AssertionResult local_198;
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_160;
  undefined4 local_14c;
  AssertionResult local_148;
  string local_138 [55];
  undefined1 local_101;
  AssertionResult local_100;
  uint local_ec;
  undefined8 local_d8;
  AssertionResult local_d0;
  undefined8 local_b8;
  undefined4 local_a4;
  AssertionResult local_a0;
  StreambufStream local_90;
  KtxTexture<ktxTexture2> local_68;
  KtxTexture<ktxTexture1> local_60 [4];
  StreambufStream local_40;
  undefined4 local_c;
  
  local_c = 0xb;
  std::make_unique<std::__cxx11::stringbuf>();
  std::unique_ptr<std::streambuf,std::default_delete<std::streambuf>>::
  unique_ptr<std::__cxx11::stringbuf,std::default_delete<std::__cxx11::stringbuf>,void>
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::operator|(_S_in,_S_out);
  StreambufStream::StreambufStream
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (openmode)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  std::
  unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
  ::~unique_ptr(in_stack_fffffffffffffd30);
  KtxTexture<ktxTexture1>::KtxTexture(local_60,(nullptr_t)0x0);
  KtxTexture<ktxTexture2>::KtxTexture(&local_68,(nullptr_t)0x0);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Loading KTX1 from file");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  StreambufStream::StreambufStream
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
             (openmode)((ulong)in_stack_fffffffffffffd40 >> 0x20));
  type = (Type)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  pkVar3 = StreambufStream::stream((StreambufStream *)0x10fef7);
  ppkVar4 = KtxTexture<ktxTexture1>::pHandle<ktxTexture1>(local_60);
  local_c = ktxTexture1_CreateFromStream(pkVar3,1,ppkVar4);
  local_a4 = 0;
  testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
            ((char *)in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30,
             (ktx_error_code_e *)in_stack_fffffffffffffd28,
             (ktx_error_code_e *)in_stack_fffffffffffffd20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd50);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffd20,(char (*) [45])in_stack_fffffffffffffd18);
    local_b8 = ktxErrorString(local_c);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffd20,(char **)in_stack_fffffffffffffd18);
    testing::AssertionResult::failure_message((AssertionResult *)0x110094);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd50,type,in_stack_fffffffffffffd40,
               (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(char *)in_stack_fffffffffffffd30);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffda0,(Message *)in_stack_fffffffffffffd98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
    testing::Message::~Message((Message *)0x1100f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110165);
  local_d8 = 0;
  testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture1>,decltype(nullptr)>
            ((char *)in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30,
             (KtxTexture<ktxTexture1> *)in_stack_fffffffffffffd28,(void **)in_stack_fffffffffffffd20
            );
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd50);
    testing::Message::operator<<
              ((Message *)in_stack_fffffffffffffd20,(char (*) [20])in_stack_fffffffffffffd18);
    testing::AssertionResult::failure_message((AssertionResult *)0x110202);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffd50,type,in_stack_fffffffffffffd40,
               (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(char *)in_stack_fffffffffffffd30);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffda0,(Message *)in_stack_fffffffffffffd98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
    testing::Message::~Message((Message *)0x110265);
  }
  local_ec = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1102e9);
  if (local_ec == 0) {
    local_101 = StreambufStream::destructed(&local_90);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffd20,(bool *)in_stack_fffffffffffffd18,
               (type *)0x110327);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_100);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd50);
      testing::Message::operator<<((Message *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,
                 in_stack_fffffffffffffd80);
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffd50,type,in_stack_fffffffffffffd40,
                 (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(char *)in_stack_fffffffffffffd30);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffda0,(Message *)in_stack_fffffffffffffd98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
      std::__cxx11::string::~string(local_138);
      testing::Message::~Message((Message *)0x11041a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1104b1);
    local_ec = 0;
  }
  StreambufStream::~StreambufStream(in_stack_fffffffffffffd60);
  if (local_ec == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Converting KTX1 -> KTX2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    StreambufStream::seek_mode(&local_40,_S_out);
    this_00 = (anonymous_namespace)::KtxTexture::operator_cast_to_ktxTexture1_
                        ((KtxTexture *)local_60);
    pkVar3 = StreambufStream::stream((StreambufStream *)0x110543);
    local_c = ktxTexture1_WriteKTX2ToStream(this_00,pkVar3);
    local_14c = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30,
               (ktx_error_code_e *)in_stack_fffffffffffffd28,
               (ktx_error_code_e *)in_stack_fffffffffffffd20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_148);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffd50);
      in_stack_fffffffffffffd98 =
           (AssertionResult *)
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffd20,(char (*) [47])in_stack_fffffffffffffd18)
      ;
      local_160 = ktxErrorString(local_c);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffd20,(char **)in_stack_fffffffffffffd18);
      testing::AssertionResult::failure_message((AssertionResult *)0x11064f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffd50,type,in_stack_fffffffffffffd40,
                 (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(char *)in_stack_fffffffffffffd30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffd98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
      testing::Message::~Message((Message *)0x1106a9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x11071a);
    poVar2 = std::operator<<((ostream *)&std::cerr,"Loading the converted KTX2");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    psVar5 = StreambufStream::streambuf((StreambufStream *)0x110754);
    std::fpos<__mbstate_t>::fpos(in_stack_fffffffffffffd20,(streamoff)in_stack_fffffffffffffd18);
    local_188 = std::streambuf::pubseekpos(psVar5,local_178,local_170,8);
    in_stack_fffffffffffffd60 = local_188._8_8_;
    StreambufStream::seek_mode(&local_40,_S_in);
    pkVar3 = StreambufStream::stream((StreambufStream *)0x1107d4);
    ppkVar6 = KtxTexture<ktxTexture2>::pHandle<ktxTexture2>(&local_68);
    local_c = ktxTexture2_CreateFromStream(pkVar3,1,ppkVar6);
    local_19c = 0;
    testing::internal::EqHelper::Compare<ktx_error_code_e,_ktx_error_code_e,_nullptr>
              ((char *)in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30,
               (ktx_error_code_e *)in_stack_fffffffffffffd28,
               (ktx_error_code_e *)in_stack_fffffffffffffd20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_198);
    if (!bVar1) {
      testing::Message::Message((Message *)pkVar3);
      pMVar7 = testing::Message::operator<<
                         ((Message *)in_stack_fffffffffffffd20,
                          (char (*) [48])in_stack_fffffffffffffd18);
      type = (Type)((ulong)pMVar7 >> 0x20);
      in_stack_fffffffffffffd40 = (char *)ktxErrorString(local_c);
      local_1b0 = in_stack_fffffffffffffd40;
      in_stack_fffffffffffffd38 =
           testing::Message::operator<<
                     ((Message *)in_stack_fffffffffffffd20,(char **)in_stack_fffffffffffffd18);
      in_stack_fffffffffffffd30 =
           (unique_ptr<std::basic_streambuf<char,_std::char_traits<char>_>,_std::default_delete<std::basic_streambuf<char,_std::char_traits<char>_>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0x1108db);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pkVar3,type,in_stack_fffffffffffffd40,
                 (int)((ulong)in_stack_fffffffffffffd38 >> 0x20),(char *)in_stack_fffffffffffffd30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffd98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
      testing::Message::~Message((Message *)0x110935);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1109a3);
    testing::internal::CmpHelperNE<(anonymous_namespace)::KtxTexture<ktxTexture2>,decltype(nullptr)>
              ((char *)in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30,
               (KtxTexture<ktxTexture2> *)in_stack_fffffffffffffd28,
               (void **)in_stack_fffffffffffffd20);
    line = (int)((ulong)in_stack_fffffffffffffd38 >> 0x20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
    if (!bVar1) {
      testing::Message::Message((Message *)pkVar3);
      testing::Message::operator<<
                ((Message *)in_stack_fffffffffffffd20,(char (*) [25])in_stack_fffffffffffffd18);
      in_stack_fffffffffffffd20 =
           (fpos<__mbstate_t> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x110a3d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)pkVar3,type,in_stack_fffffffffffffd40,line,
                 (char *)in_stack_fffffffffffffd30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)this_00,(Message *)in_stack_fffffffffffffd98);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd20);
      testing::Message::~Message((Message *)0x110a97);
    }
    local_ec = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x110b1b);
    if (local_ec == 0) {
      local_ec = 0;
    }
  }
  KtxTexture<ktxTexture2>::~KtxTexture((KtxTexture<ktxTexture2> *)in_stack_fffffffffffffd30);
  KtxTexture<ktxTexture1>::~KtxTexture((KtxTexture<ktxTexture1> *)in_stack_fffffffffffffd30);
  StreambufStream::~StreambufStream(in_stack_fffffffffffffd60);
  std::
  unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringbuf<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffd20);
  return;
}

Assistant:

TEST_F(ktxStreamTest, CanWriteKtx1AsKtx2ToCppStream)
{
    KTX_error_code err{KTX_INVALID_VALUE};
    auto dstStreambuf = std::make_unique<std::stringbuf>();
    StreambufStream dstStream{std::move(dstStreambuf)};

    KtxTexture<ktxTexture1> srcTexture1{nullptr};
    KtxTexture<ktxTexture2> dstTexture2{nullptr};

    {
        std::cerr << "Loading KTX1 from file" << std::endl;

        StreambufStream srcStream{std::move(_ktx1Streambuf), std::ios::in};
        err = ktxTexture1_CreateFromStream(srcStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, srcTexture1.pHandle());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to load source KTX1 from C++ stream: " << ktxErrorString(err);
        ASSERT_NE(srcTexture1, nullptr) << "Source KTX1 is null";
        EXPECT_TRUE(srcStream.destructed()) << "ktxStream should have been destructed (LOAD_IMAGE_DATA_BIT set)";
    }
    {
        std::cerr << "Converting KTX1 -> KTX2" << std::endl;

        // We're about to write to `dstStream`
        dstStream.seek_mode(std::ios::out);

        err = ktxTexture1_WriteKTX2ToStream(srcTexture1, dstStream.stream());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to convert KTX1 -> KTX2 to C++ stream: " << ktxErrorString(err);
    }
    {
        std::cerr << "Loading the converted KTX2" << std::endl;

        // Rewind dstStream and set it up for reading
        dstStream.streambuf()->pubseekpos(0, std::ios::in);
        dstStream.seek_mode(std::ios::in);

        err = ktxTexture2_CreateFromStream(dstStream.stream(), KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT, dstTexture2.pHandle());
        EXPECT_EQ(err, KTX_SUCCESS) << "Failed to load converted KTX2 from C++ stream: " << ktxErrorString(err);
        ASSERT_NE(dstTexture2, nullptr) << "Destination KTX2 is null";
    }
}